

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.cc
# Opt level: O1

void read_numbered_sentence_pair
               (string *line,vector<int,_std::allocator<int>_> *s,Dict *sd,
               vector<int,_std::allocator<int>_> *t,Dict *td,
               vector<int,_std::allocator<int>_> *identifiers)

{
  pointer piVar1;
  iterator iVar2;
  int iVar3;
  istream *piVar4;
  string sep;
  string word;
  istringstream in;
  int local_204;
  undefined1 *local_200;
  size_t local_1f8;
  undefined1 local_1f0 [16];
  string local_1e0;
  vector<int,_std::allocator<int>_> *local_1c0;
  Dict *local_1b8;
  long local_1b0 [4];
  byte abStack_190 [88];
  ios_base local_138 [264];
  
  local_1c0 = t;
  local_1b8 = td;
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)line,_S_in);
  local_1e0._M_string_length = 0;
  local_1e0.field_2._M_local_buf[0] = '\0';
  local_200 = local_1f0;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"|||","");
  if ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 5) == 0) {
    piVar1 = (identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
        ._M_finish != piVar1) {
      (identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = piVar1;
    }
    while ((((piVar4 = std::operator>>((istream *)local_1b0,(string *)&local_1e0),
             ((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0 &&
             ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 5) == 0)) &&
            (local_1e0._M_string_length != 0)) &&
           ((local_1e0._M_string_length != local_1f8 ||
            (iVar3 = bcmp(local_1e0._M_dataplus._M_p,local_200,local_1e0._M_string_length),
            iVar3 != 0))))) {
      local_204 = atoi(local_1e0._M_dataplus._M_p);
      iVar2._M_current =
           (identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(identifiers,iVar2,&local_204)
        ;
      }
      else {
        *iVar2._M_current = local_204;
        (identifiers->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
        ._M_finish = iVar2._M_current + 1;
      }
    }
  }
  if ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 5) == 0) {
    do {
      while( true ) {
        std::operator>>((istream *)local_1b0,(string *)&local_1e0);
        if ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 5) != 0) goto LAB_0012498d;
        if ((local_1e0._M_string_length == local_1f8) &&
           ((local_1e0._M_string_length == 0 ||
            (iVar3 = bcmp(local_1e0._M_dataplus._M_p,local_200,local_1e0._M_string_length),
            iVar3 == 0)))) break;
        local_204 = dynet::Dict::convert(sd,&local_1e0);
        iVar2._M_current =
             (s->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
        if (iVar2._M_current ==
            (s->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(s,iVar2,&local_204);
        }
        else {
          *iVar2._M_current = local_204;
          (s->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar2._M_current + 1;
        }
        if ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 5) != 0) goto LAB_0012498d;
      }
      sd = local_1b8;
      s = local_1c0;
    } while ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 5) == 0);
  }
LAB_0012498d:
  if (local_200 != local_1f0) {
    operator_delete(local_200);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void read_numbered_sentence_pair(const std::string& line, std::vector<int>* s, Dict* sd, std::vector<int>* t, Dict* td, vector<int> &identifiers) 
{
    std::istringstream in(line);
    std::string word;
    std::string sep = "|||";
    Dict* d = sd;
    std::vector<int>* v = s; 

    if (in) {
        identifiers.clear();
        while (in >> word) {
            if (!in || word.empty()) break;
            if (word == sep) break;
            identifiers.push_back(atoi(word.c_str()));
        }
    }

    while(in) {
        in >> word;
        if (!in) break;
        if (word == sep) { d = td; v = t; continue; }
        v->push_back(d->convert(word));
    }
}